

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample3DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,float t,float r,
          IVec3 *offset)

{
  WrapMode WVar1;
  int iVar2;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  IVec3 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined4 in_XMM1_Db;
  undefined8 uVar3;
  Vec4 VVar4;
  Vec4 VVar5;
  float local_44;
  float local_40;
  float w;
  float v;
  float u;
  IVec3 *offset_local;
  float r_local;
  float t_local;
  float s_local;
  FilterMode filter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *this_local;
  undefined1 auVar6 [12];
  undefined8 uVar7;
  
  uVar3 = CONCAT44(in_XMM1_Db,t);
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  local_44 = r;
  local_40 = t;
  w = s;
  if ((sampler_00->normalizedCoords & 1U) != 0) {
    WVar1 = sampler_00->wrapS;
    iVar2 = Vector<int,_3>::x((Vector<int,_3> *)&sampler->wrapR);
    w = unnormalize(WVar1,s,iVar2);
    WVar1 = sampler_00->wrapT;
    iVar2 = Vector<int,_3>::y((Vector<int,_3> *)&sampler->wrapR);
    local_40 = unnormalize(WVar1,t,iVar2);
    WVar1 = sampler_00->wrapR;
    iVar2 = Vector<int,_3>::z((Vector<int,_3> *)&sampler->wrapR);
    local_44 = unnormalize(WVar1,r,iVar2);
  }
  if ((int)offset == 0) {
    VVar4 = sampleNearest3D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,w,local_40,
                            local_44,in_R8);
  }
  else if ((int)offset == 1) {
    VVar4 = sampleLinear3D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,w,local_40,
                           local_44,in_R8);
  }
  else {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,0.0);
    VVar4.m_data[2] = (float)(int)uVar3;
    VVar4.m_data[3] = (float)(int)((ulong)uVar3 >> 0x20);
    VVar4.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar4.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  VVar5.m_data[0] = VVar4.m_data[0];
  auVar6._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  register0x00001244 = VVar4.m_data[3];
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample3DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, float t, float r, const IVec3& offset) const
{
	// Non-normalized coordinates.
	float u = s;
	float v = t;
	float w = r;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
		w = unnormalize(sampler.wrapR, r, m_size.z());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest3D	(*this, sampler, u, v, w, offset);
		case Sampler::LINEAR:	return sampleLinear3D	(*this, sampler, u, v, w, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}